

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.h
# Opt level: O2

void __thiscall flow::Handler::~Handler(Handler *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

~Handler() = default;